

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_printf.h
# Opt level: O3

int stbsp__real_to_str(char **start,uint *len,char *out,int *decimal_pos,double value,
                      uint frac_digits)

{
  uint uVar1;
  uint uVar2;
  double dVar3;
  char *pcVar4;
  double dVar5;
  double *pdVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong *puVar12;
  uint uVar13;
  char *pcVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  
  uVar1 = (uint)((ulong)value >> 0x20);
  uVar2 = uVar1 >> 0x14 & 0x7ff;
  if (((ulong)value >> 0x34 & 0x7ff) == 0) {
    if ((value == 0.0) && (!NAN(value))) {
      *decimal_pos = 1;
      *start = out;
      *out = '0';
      uVar2 = 1;
      goto LAB_0010ac6e;
    }
    iVar16 = -0x3ff;
    if (((ulong)value >> 0x33 & 1) == 0) {
      uVar7 = 0x8000000000000;
      uVar2 = 0;
      do {
        uVar2 = uVar2 - 1;
        uVar7 = uVar7 >> 1;
      } while ((uVar7 & (ulong)value) == 0);
      goto LAB_0010a62e;
    }
LAB_0010a63b:
    iVar16 = -((uint)(iVar16 * -0x269) >> 0xb);
  }
  else {
    if (uVar2 == 0x7ff) {
      pcVar4 = "NaN";
      if (((ulong)value & 0xfffffffffffff) == 0) {
        pcVar4 = "Inf";
      }
      *start = pcVar4;
      *decimal_pos = 0x7000;
      uVar2 = 3;
      goto LAB_0010ac6e;
    }
LAB_0010a62e:
    iVar16 = uVar2 - 0x3ff;
    if ((int)uVar2 < 0x3ff) goto LAB_0010a63b;
    iVar16 = ((uint)(iVar16 * 0x4d1) >> 0xc) + 1;
  }
  dVar21 = ABS(value);
  uVar2 = 0x12 - iVar16;
  if (uVar2 < 0x17) {
    dVar18 = stbsp__bot[uVar2];
    dVar19 = dVar21 * dVar18;
    dVar5 = (double)((ulong)dVar21 & 0x7ffffffff8000000);
    dVar3 = (double)((ulong)dVar18 & 0xfffffffff8000000);
    dVar18 = (dVar18 - dVar3) * (dVar21 - dVar5) +
             dVar3 * (dVar21 - dVar5) + dVar5 * (dVar18 - dVar3) + (dVar5 * dVar3 - dVar19);
  }
  else {
    uVar13 = -uVar2;
    if (0 < (int)uVar2) {
      uVar13 = uVar2;
    }
    uVar8 = uVar13 * 0x2c9 >> 0xe;
    uVar2 = 0xd;
    if (uVar8 < 0xd) {
      uVar2 = uVar8;
    }
    iVar9 = uVar2 * -0x17 + uVar13;
    dVar19 = dVar21;
    if (iVar16 < 0x13) {
      if (iVar9 == 0) {
        dVar18 = 0.0;
      }
      else {
        iVar10 = 0x16;
        if (iVar9 < 0x16) {
          iVar10 = iVar9;
        }
        dVar18 = stbsp__bot[iVar10];
        dVar19 = dVar21 * dVar18;
        dVar5 = (double)((ulong)dVar21 & 0x7ffffffff8000000);
        dVar3 = (double)((ulong)dVar18 & 0xfffffffff8000000);
        dVar18 = (dVar18 - dVar3) * (dVar21 - dVar5) +
                 dVar3 * (dVar21 - dVar5) + dVar5 * (dVar18 - dVar3) + (dVar5 * dVar3 - dVar19);
        if (0x16 < iVar9) {
          dVar20 = dVar19 + dVar18;
          dVar21 = stbsp__bot[(uint)(iVar9 - iVar10)];
          dVar3 = (double)((ulong)dVar20 & 0xfffffffff8000000);
          dVar5 = (double)((ulong)dVar21 & 0xfffffffff8000000);
          dVar18 = (dVar18 - (dVar20 - dVar19)) * dVar21 +
                   (dVar21 - dVar5) * (dVar20 - dVar3) +
                   dVar5 * (dVar20 - dVar3) +
                   dVar3 * (dVar21 - dVar5) + (dVar3 * dVar5 - dVar20 * dVar21);
          dVar19 = dVar20 * dVar21;
        }
      }
      if (uVar13 < 0x17) goto LAB_0010a9e0;
      dVar20 = dVar19 + dVar18;
      dVar22 = dVar20 - dVar19;
      dVar21 = *(double *)(&DAT_0010c858 + (ulong)uVar2 * 8);
      dVar3 = (double)((ulong)dVar20 & 0xfffffffff8000000);
      dVar19 = dVar20 * dVar21;
      dVar5 = (double)((ulong)dVar21 & 0xfffffffff8000000);
      dVar18 = (dVar18 - dVar22) * dVar21;
      dVar22 = dVar5 * (dVar20 - dVar3) + dVar3 * (dVar21 - dVar5) + (dVar3 * dVar5 - dVar19);
      dVar21 = (dVar21 - dVar5) * (dVar20 - dVar3);
      pdVar6 = stbsp__toperr;
    }
    else {
      if (iVar9 == 0) {
        dVar18 = 0.0;
      }
      else {
        dVar19 = *(double *)(&DAT_0010c618 + (long)iVar9 * 8);
        dVar3 = (double)((ulong)dVar21 & 0x7ffffffff8000000);
        dVar18 = (double)((ulong)dVar19 & 0xfffffffff8000000);
        dVar18 = stbsp__negbot[(long)iVar9 + 0x15] * dVar21 +
                 (dVar19 - dVar18) * (dVar21 - dVar3) +
                 dVar18 * (dVar21 - dVar3) +
                 dVar3 * (dVar19 - dVar18) + (dVar3 * dVar18 - dVar21 * dVar19);
        dVar19 = dVar21 * dVar19;
      }
      if (uVar13 < 0x17) goto LAB_0010a9e0;
      dVar20 = dVar19 + dVar18;
      dVar22 = dVar20 - dVar19;
      dVar21 = stbsp__negboterr[(ulong)uVar2 + 0x15];
      dVar3 = (double)((ulong)dVar20 & 0xfffffffff8000000);
      dVar19 = dVar20 * dVar21;
      dVar5 = (double)((ulong)dVar21 & 0xfffffffff8000000);
      dVar18 = (dVar18 - dVar22) * dVar21;
      dVar22 = dVar5 * (dVar20 - dVar3) + dVar3 * (dVar21 - dVar5) + (dVar3 * dVar5 - dVar19);
      dVar21 = (dVar21 - dVar5) * (dVar20 - dVar3);
      pdVar6 = stbsp__negtoperr;
    }
    dVar18 = dVar20 * pdVar6[(ulong)uVar2 - 1] + dVar18 + dVar21 + dVar22;
  }
LAB_0010a9e0:
  dVar3 = dVar19 + dVar18;
  dVar21 = (double)(long)dVar3;
  dVar5 = dVar3 - dVar21;
  uVar7 = (long)(((dVar3 - (dVar5 - (dVar5 - dVar3))) - ((dVar5 - dVar3) + dVar21)) + dVar5 +
                (dVar18 - (dVar3 - dVar19))) + (long)dVar3;
  iVar16 = iVar16 + (uint)(999999999999999999 < uVar7);
  uVar2 = iVar16 + frac_digits;
  if ((int)frac_digits < 0) {
    uVar2 = (frac_digits & 0x7ffffff) + 1;
  }
  if (uVar2 < 0x18) {
    uVar13 = (uint)(999999999 < uVar7) * 9;
    puVar12 = stbsp__powten + uVar13;
    uVar13 = ~uVar13;
    do {
      puVar12 = puVar12 + 1;
      if (uVar7 < *puVar12) {
        if ((uVar2 < -uVar13) && (-(uVar2 + uVar13) < 0x18)) {
          uVar7 = (stbsp__powten[-(uVar2 + uVar13)] >> 1) + uVar7;
          iVar16 = (iVar16 + 1) - (uint)(uVar7 < *puVar12);
          uVar7 = uVar7 / stbsp__powten[-(uVar2 + uVar13)];
        }
        break;
      }
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0xffffffec);
  }
  if (uVar7 == 0) {
    uVar7 = 0;
  }
  else {
    if (0xffffffff < (long)uVar7) {
      do {
        if (0x4189374bc6a7ef <
            (uVar7 * 0x1cac083126e978d5 >> 3 | uVar7 * 0x1cac083126e978d5 << 0x3d))
        goto LAB_0010ab7c;
        uVar11 = uVar7 / 1000;
        uVar17 = uVar7 >> 0x23;
        uVar7 = uVar11;
      } while (0x7c < (uint)uVar17);
    }
    uVar2 = (uint)((int)uVar7 * 0x26e978d5) >> 3 | (int)uVar7 * -0x60000000;
    while (uVar2 < 0x418938) {
      uVar17 = uVar7 & 0xffffffff;
      uVar7 = uVar17 / 1000;
      iVar9 = (int)(uVar17 / 1000);
      uVar2 = (uint)(iVar9 * 0x26e978d5) >> 3 | iVar9 * -0x60000000;
    }
    uVar7 = uVar7 & 0xffffffff;
  }
LAB_0010ab7c:
  pcVar4 = out + 0x40;
  pcVar14 = out + 0x3e;
  uVar17 = 0;
  do {
    uVar2 = (uint)uVar17;
    if ((long)uVar7 < 100000000) {
      uVar11 = 0;
      if ((int)uVar7 == 0) {
        lVar15 = 0;
        goto LAB_0010ac37;
      }
LAB_0010abc8:
      lVar15 = 0;
      do {
        uVar13 = (uint)uVar7;
        uVar7 = (uVar7 & 0xffffffff) / 100;
        *(undefined2 *)(pcVar14 + lVar15) =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (ulong)(uVar13 + (int)uVar7 * -100) * 2);
        lVar15 = lVar15 + -2;
      } while (99 < uVar13);
      if (uVar11 == 0) break;
      uVar17 = (uVar17 & 0xffffffff) - lVar15;
      uVar2 = (uint)uVar17;
      uVar7 = uVar11;
      if (lVar15 != -8) goto LAB_0010ac05;
    }
    else {
      uVar11 = uVar7 / 100000000;
      uVar7 = uVar7 % 100000000;
      if (uVar7 != 0) goto LAB_0010abc8;
      lVar15 = 0;
LAB_0010ac05:
      memset(pcVar4 + -8,0x30,lVar15 + 8);
      uVar17 = (ulong)(uVar2 + (int)lVar15 + 8);
      uVar7 = uVar11;
    }
    pcVar4 = pcVar4 + -8;
    pcVar14 = pcVar14 + -8;
  } while( true );
  uVar2 = uVar2 - (int)lVar15;
LAB_0010ac37:
  pcVar4 = pcVar4 + lVar15;
  if (uVar2 == 0) {
    uVar2 = 0;
  }
  else if (*pcVar4 == '0') {
    pcVar4 = pcVar4 + 1;
    uVar2 = uVar2 - 1;
  }
  *decimal_pos = iVar16;
  *start = pcVar4;
LAB_0010ac6e:
  *len = uVar2;
  return (int)uVar1 >> 0x1f;
}

Assistant:

static stbsp__int32 stbsp__real_to_str(char const **start, stbsp__uint32 *len, char *out, stbsp__int32 *decimal_pos, double value, stbsp__uint32 frac_digits)
{
   double d;
   stbsp__int64 bits = 0;
   stbsp__int32 expo, e, ng, tens;

   d = value;
   STBSP__COPYFP(bits, d);
   expo = (stbsp__int32)((bits >> 52) & 2047);
   ng = (stbsp__int32)(bits >> 63);
   if (ng)
      d = -d;

   if (expo == 2047) // is nan or inf?
   {
      *start = (bits & ((((stbsp__uint64)1) << 52) - 1)) ? "NaN" : "Inf";
      *decimal_pos = STBSP__SPECIAL;
      *len = 3;
      return ng;
   }

   if (expo == 0) // is zero or denormal
   {
      if ((bits << 1) == 0) // do zero
      {
         *decimal_pos = 1;
         *start = out;
         out[0] = '0';
         *len = 1;
         return ng;
      }
      // find the right expo for denormals
      {
         stbsp__int64 v = ((stbsp__uint64)1) << 51;
         while ((bits & v) == 0) {
            --expo;
            v >>= 1;
         }
      }
   }

   // find the decimal exponent as well as the decimal bits of the value
   {
      double ph, pl;

      // log10 estimate - very specifically tweaked to hit or undershoot by no more than 1 of log10 of all expos 1..2046
      tens = expo - 1023;
      tens = (tens < 0) ? ((tens * 617) / 2048) : (((tens * 1233) / 4096) + 1);

      // move the significant bits into position and stick them into an int
      stbsp__raise_to_power10(&ph, &pl, d, 18 - tens);

      // get full as much precision from double-double as possible
      stbsp__ddtoS64(bits, ph, pl);

      // check if we undershot
      if (((stbsp__uint64)bits) >= stbsp__tento19th)
         ++tens;
   }

   // now do the rounding in integer land
   frac_digits = (frac_digits & 0x80000000) ? ((frac_digits & 0x7ffffff) + 1) : (tens + frac_digits);
   if ((frac_digits < 24)) {
      stbsp__uint32 dg = 1;
      if ((stbsp__uint64)bits >= stbsp__powten[9])
         dg = 10;
      while ((stbsp__uint64)bits >= stbsp__powten[dg]) {
         ++dg;
         if (dg == 20)
            goto noround;
      }
      if (frac_digits < dg) {
         stbsp__uint64 r;
         // add 0.5 at the right position and round
         e = dg - frac_digits;
         if ((stbsp__uint32)e >= 24)
            goto noround;
         r = stbsp__powten[e];
         bits = bits + (r / 2);
         if ((stbsp__uint64)bits >= stbsp__powten[dg])
            ++tens;
         bits /= r;
      }
   noround:;
   }

   // kill long trailing runs of zeros
   if (bits) {
      stbsp__uint32 n;
      for (;;) {
         if (bits <= 0xffffffff)
            break;
         if (bits % 1000)
            goto donez;
         bits /= 1000;
      }
      n = (stbsp__uint32)bits;
      while ((n % 1000) == 0)
         n /= 1000;
      bits = n;
   donez:;
   }

   // convert to string
   out += 64;
   e = 0;
   for (;;) {
      stbsp__uint32 n;
      char *o = out - 8;
      // do the conversion in chunks of U32s (avoid most 64-bit divides, worth it, constant denomiators be damned)
      if (bits >= 100000000) {
         n = (stbsp__uint32)(bits % 100000000);
         bits /= 100000000;
      } else {
         n = (stbsp__uint32)bits;
         bits = 0;
      }
      while (n) {
         out -= 2;
         *(stbsp__uint16 *)out = *(stbsp__uint16 *)&stbsp__digitpair[(n % 100) * 2];
         n /= 100;
         e += 2;
      }
      if (bits == 0) {
         if ((e) && (out[0] == '0')) {
            ++out;
            --e;
         }
         break;
      }
      while (out != o) {
         *--out = '0';
         ++e;
      }
   }

   *decimal_pos = tens;
   *start = out;
   *len = e;
   return ng;
}